

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,string *linkLibraries,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *tgt,bool relink,bool forResponseFile,bool useWatcomQuote)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  TargetType TVar5;
  PolicyStatus PVar6;
  char *pcVar7;
  cmComputeLinkInformation *pcVar8;
  cmState *this_00;
  ostream *poVar9;
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  ItemVector *pIVar11;
  size_t sVar12;
  PolicyID id;
  PolicyID id_00;
  string *psVar13;
  undefined7 in_register_00000089;
  pointer pbVar14;
  pointer pIVar15;
  string rpath_link;
  string standardLibsVar;
  string linkLibs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDirs;
  string linkLanguage;
  string libPathTerminator;
  string fwSearchFlagVar;
  string libPathFlag;
  string config;
  ostringstream fout;
  string local_490;
  cmComputeLinkInformation *local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  OutputFormat local_444;
  char *local_440;
  char *local_438;
  char local_430;
  undefined7 uStack_42f;
  undefined4 local_41c;
  undefined1 local_418 [40];
  string *local_3f0;
  long *local_3e8 [2];
  long local_3d8 [2];
  string *local_3c8;
  string local_3c0;
  long *local_3a0 [2];
  long local_390 [2];
  string local_380;
  undefined1 local_360 [112];
  ios_base local_2f0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  local_41c = (undefined4)CONCAT71(in_register_00000089,relink);
  local_444 = RESPONSE;
  if (!forResponseFile) {
    local_444 = useWatcomQuote | SHELL;
  }
  local_3f0 = frameworkPath;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar1 = this->Makefile;
  local_360._0_8_ = local_360 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"CMAKE_BUILD_TYPE","");
  pcVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_360);
  std::__cxx11::string::string((string *)&local_1c8,pcVar7,(allocator *)&local_440);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  pcVar8 = cmGeneratorTarget::GetLinkInformation(tgt,&local_1c8);
  if (pcVar8 == (cmComputeLinkInformation *)0x0) goto LAB_002423da;
  local_440 = &local_430;
  local_438 = (char *)0x0;
  local_430 = '\0';
  local_3e8[0] = local_3d8;
  pcVar2 = (pcVar8->LinkLanguage)._M_dataplus._M_p;
  local_470 = pcVar8;
  local_3c8 = linkLibraries;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3e8,pcVar2,pcVar2 + (pcVar8->LinkLanguage)._M_string_length);
  pcVar1 = this->Makefile;
  local_360._0_8_ = local_360 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"CMAKE_LIBRARY_PATH_FLAG","");
  pcVar7 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)local_360);
  std::__cxx11::string::string((string *)&local_1e8,pcVar7,(allocator *)local_3a0);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  pcVar1 = this->Makefile;
  local_360._0_8_ = local_360 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_360,"CMAKE_LIBRARY_PATH_TERMINATOR","");
  pcVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_360);
  std::__cxx11::string::string((string *)local_3a0,pcVar7,(allocator *)&local_3c0);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  TVar5 = cmGeneratorTarget::GetType(tgt);
  if (TVar5 == EXECUTABLE) {
    this_00 = cmState::Snapshot::GetState(&this->StateSnapshot);
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3c0,"TARGET_SUPPORTS_SHARED_LIBS","");
    bVar4 = cmState::GetGlobalPropertyAsBool(this_00,&local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4 == false) goto switchD_0024191c_default;
  PVar6 = cmPolicies::PolicyMap::Get(&tgt->PolicyMap,CMP0065);
  switch(PVar6) {
  case WARN:
    local_360._0_8_ = local_360 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"ENABLE_EXPORTS","");
    bVar4 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_360);
    if (bVar4) {
      bVar4 = false;
    }
    else {
      pcVar1 = this->Makefile;
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_380,"CMAKE_POLICY_WARNING_CMP0065","");
      bVar4 = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,&local_380);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
    }
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    if (bVar4 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_490,(cmPolicies *)0x41,id_00);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_360,local_490._M_dataplus._M_p,local_490._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of thier ENABLE_EXPORTS property."
                 ,0xa0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,
                        CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                                 local_490.field_2._M_local_buf[0]) + 1);
      }
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_490,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,
                        CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                                 local_490.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
      std::ios_base::~ios_base(local_2f0);
    }
  case OLD:
switchD_0024191c_caseD_0:
    local_360._0_8_ = local_360 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360,"CMAKE_SHARED_LIBRARY_LINK_","");
    std::__cxx11::string::_M_append(local_360,(ulong)local_3e8[0]);
    std::__cxx11::string::append(local_360);
    __s = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_360);
    pcVar7 = local_438;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_440,0,pcVar7,(ulong)__s);
    std::__cxx11::string::append((char *)&local_440);
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    break;
  case NEW:
    goto switchD_0024191c_caseD_2;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    pcVar1 = this->Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_360,(cmPolicies *)0x41,id);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_360,false);
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
switchD_0024191c_caseD_2:
    local_360._0_8_ = local_360 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"ENABLE_EXPORTS","");
    bVar4 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_360);
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    if (bVar4) goto switchD_0024191c_caseD_0;
    break;
  default:
    break;
  }
switchD_0024191c_default:
  local_360._0_8_ = local_360 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"CMAKE_","");
  std::__cxx11::string::_M_append(local_360,(ulong)local_3e8[0]);
  std::__cxx11::string::append(local_360);
  pcVar7 = cmMakefile::GetDefinition(this->Makefile,(string *)local_360);
  if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
    pvVar10 = cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(local_470);
    pbVar14 = (pvVar10->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar14 !=
        (pvVar10->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::string::append((char *)local_3f0);
        cmOutputConverter::Convert(&local_490,&this->super_cmOutputConverter,pbVar14,NONE,local_444)
        ;
        std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_490._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p,
                          CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                                   local_490.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::string::append((char *)local_3f0);
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 !=
               (pvVar10->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  pvVar10 = cmComputeLinkInformation::GetDirectories_abi_cxx11_(local_470);
  pbVar14 = (pvVar10->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar14 !=
      (pvVar10->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmOutputConverter::ConvertToOutputForExisting
                (&local_490,&this->super_cmOutputConverter,pbVar14,START_OUTPUT,local_444);
      std::operator+(&local_468," ",&local_1e8);
      std::__cxx11::string::_M_append((char *)linkPath,(ulong)local_468._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_append((char *)linkPath,(ulong)local_490._M_dataplus._M_p);
      std::__cxx11::string::_M_append((char *)linkPath,(ulong)local_3a0[0]);
      std::__cxx11::string::append((char *)linkPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,
                        CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                                 local_490.field_2._M_local_buf[0]) + 1);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 !=
             (pvVar10->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  pIVar11 = cmComputeLinkInformation::GetItems(local_470);
  pIVar15 = (pIVar11->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pIVar15 !=
      (pIVar11->
      super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if ((pIVar15->Target == (cmGeneratorTarget *)0x0) ||
         (TVar5 = cmGeneratorTarget::GetType(pIVar15->Target), TVar5 != INTERFACE_LIBRARY)) {
        if (pIVar15->IsPath == true) {
          (*this->_vptr_cmLocalGenerator[0xd])(&local_490,this,pIVar15);
          std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_490._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_490._M_dataplus._M_p != &local_490.field_2) {
            operator_delete(local_490._M_dataplus._M_p,
                            CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                                     local_490.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append
                    ((char *)&local_440,(ulong)(pIVar15->Value)._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)&local_440);
      }
      pIVar15 = pIVar15 + 1;
    } while (pIVar15 !=
             (pIVar11->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_440,(long)local_438)
  ;
  if ((local_470->RuntimeSep)._M_string_length == 0) {
    local_418._0_8_ = (string *)0x0;
    local_418._8_8_ = (string *)0x0;
    local_418._16_8_ = (pointer)0x0;
    cmComputeLinkInformation::GetRPath
              (local_470,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_418,local_41c._0_1_);
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    local_490._M_string_length = 0;
    local_490.field_2._M_local_buf[0] = '\0';
    if (local_418._0_8_ != local_418._8_8_) {
      psVar13 = (string *)local_418._0_8_;
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_490,(ulong)(local_470->RuntimeFlag)._M_dataplus._M_p);
        cmOutputConverter::Convert(&local_468,&this->super_cmOutputConverter,psVar13,NONE,local_444)
        ;
        std::__cxx11::string::_M_append((char *)&local_490,(ulong)local_468._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_490);
        psVar13 = psVar13 + 1;
      } while (psVar13 != (string *)local_418._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_490._M_dataplus._M_p,local_490._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,
                      CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                               local_490.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_418);
  }
  else {
    cmComputeLinkInformation::GetRPathString_abi_cxx11_(&local_490,local_470,local_41c._0_1_);
    if (local_490._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(local_470->RuntimeFlag)._M_dataplus._M_p,
                 (local_470->RuntimeFlag)._M_string_length);
      cmOutputConverter::EscapeForShell
                (&local_468,&this->super_cmOutputConverter,&local_490,!forResponseFile,false,false);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_468._M_dataplus._M_p,local_468._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,
                      CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                               local_490.field_2._M_local_buf[0]) + 1);
    }
  }
  pcVar8 = local_470;
  cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_(&local_490,local_470);
  sVar3 = (pcVar8->RPathLinkFlag)._M_string_length;
  if ((sVar3 != 0) && (local_490._M_string_length != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(local_470->RPathLinkFlag)._M_dataplus._M_p,sVar3);
    cmOutputConverter::EscapeForShell
              (&local_468,&this->super_cmOutputConverter,&local_490,!forResponseFile,false,false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_468._M_dataplus._M_p,local_468._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  }
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"CMAKE_","");
  psVar13 = (string *)(local_418 + 0x10);
  pcVar2 = (local_470->LinkLanguage)._M_dataplus._M_p;
  local_418._0_8_ = psVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_418,pcVar2,pcVar2 + (local_470->LinkLanguage)._M_string_length);
  std::__cxx11::string::_M_append((char *)&local_468,local_418._0_8_);
  if ((string *)local_418._0_8_ != psVar13) {
    operator_delete((void *)local_418._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_418._16_8_)->_M_p + 1));
  }
  std::__cxx11::string::append((char *)&local_468);
  pcVar7 = cmMakefile::GetDefinition(this->Makefile,&local_468);
  if (pcVar7 != (char *)0x0) {
    sVar12 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_3c8,(string *)local_418);
  if ((string *)local_418._0_8_ != psVar13) {
    operator_delete((void *)local_418._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_418._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,
                    CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                             local_490.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440,CONCAT71(uStack_42f,local_430) + 1);
  }
LAB_002423da:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(std::string& linkLibraries,
                                           std::string& frameworkPath,
                                           std::string& linkPath,
                                           cmGeneratorTarget &tgt,
                                           bool relink,
                                           bool forResponseFile,
                                           bool useWatcomQuote)
{
  OutputFormat shellFormat = (forResponseFile) ? RESPONSE :
                             ((useWatcomQuote) ? WATCOMQUOTE : SHELL);
  bool escapeAllowMakeVars = !forResponseFile;
  std::ostringstream fout;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmComputeLinkInformation* pcli = tgt.GetLinkInformation(config);
  if(!pcli)
    {
    return;
    }
  cmComputeLinkInformation& cli = *pcli;

  // Collect library linking flags command line options.
  std::string linkLibs;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  std::string libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmState::EXECUTABLE &&
      this->StateSnapshot.GetState()->
        GetGlobalPropertyAsBool("TARGET_SUPPORTS_SHARED_LIBS"))
    {
    bool add_shlib_flags = false;
    switch(tgt.GetPolicyStatusCMP0065())
      {
      case cmPolicies::WARN:
        if(!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
           this->Makefile->PolicyOptionalWarningEnabled(
             "CMAKE_POLICY_WARNING_CMP0065"))
          {
          std::ostringstream w;
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
            "For compatibility with older versions of CMake, "
            "additional flags may be added to export symbols on all "
            "executables regardless of thier ENABLE_EXPORTS property.";
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
          }
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags
        add_shlib_flags = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065)
          );
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on
        add_shlib_flags = tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
      }

    if(add_shlib_flags)
      {
      std::string linkFlagsVar = "CMAKE_SHARED_LIBRARY_LINK_";
      linkFlagsVar += linkLanguage;
      linkFlagsVar += "_FLAGS";
      linkLibs = this->Makefile->GetSafeDefinition(linkFlagsVar);
      linkLibs += " ";
      }
    }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);
  if(fwSearchFlag && *fwSearchFlag)
    {
    std::vector<std::string> const& fwDirs = cli.GetFrameworkPaths();
    for(std::vector<std::string>::const_iterator fdi = fwDirs.begin();
        fdi != fwDirs.end(); ++fdi)
      {
      frameworkPath += fwSearchFlag;
      frameworkPath += this->Convert(*fdi, NONE, shellFormat);
      frameworkPath += " ";
      }
    }

  // Append the library search path flags.
  std::vector<std::string> const& libDirs = cli.GetDirectories();
  for(std::vector<std::string>::const_iterator libDir = libDirs.begin();
      libDir != libDirs.end(); ++libDir)
    {
    std::string libpath = this->ConvertToOutputForExisting(*libDir,
                                                           START_OUTPUT,
                                                           shellFormat);
    linkPath += " " + libPathFlag;
    linkPath += libpath;
    linkPath += libPathTerminator;
    linkPath += " ";
    }

  // Append the link items.
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for(ItemVector::const_iterator li = items.begin(); li != items.end(); ++li)
    {
    if(li->Target && li->Target->GetType() == cmState::INTERFACE_LIBRARY)
      {
      continue;
      }
    if(li->IsPath)
      {
      linkLibs += this->ConvertToLinkReference(li->Value, shellFormat);
      }
    else
      {
      linkLibs += li->Value;
      }
    linkLibs += " ";
    }

  // Write the library flags to the build rule.
  fout << linkLibs;

  // Check what kind of rpath flags to use.
  if(cli.GetRuntimeSep().empty())
    {
    // Each rpath entry gets its own option ("-R a -R b -R c")
    std::vector<std::string> runtimeDirs;
    cli.GetRPath(runtimeDirs, relink);

    std::string rpath;
    for(std::vector<std::string>::iterator ri = runtimeDirs.begin();
        ri != runtimeDirs.end(); ++ri)
      {
      rpath += cli.GetRuntimeFlag();
      rpath += this->Convert(*ri, NONE, shellFormat);
      rpath += " ";
      }
    fout << rpath;
    }
  else
    {
    // All rpath entries are combined ("-Wl,-rpath,a:b:c").
    std::string rpath = cli.GetRPathString(relink);

    // Store the rpath option in the stream.
    if(!rpath.empty())
      {
      fout << cli.GetRuntimeFlag();
      fout << this->EscapeForShell(rpath, escapeAllowMakeVars);
      fout << " ";
      }
    }

  // Add the linker runtime search path if any.
  std::string rpath_link = cli.GetRPathLinkString();
  if(!cli.GetRPathLinkFlag().empty() && !rpath_link.empty())
    {
    fout << cli.GetRPathLinkFlag();
    fout << this->EscapeForShell(rpath_link, escapeAllowMakeVars);
    fout << " ";
    }

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  if(const char* stdLibs =
     this->Makefile->GetDefinition(standardLibsVar))
    {
    fout << stdLibs << " ";
    }

  linkLibraries = fout.str();
}